

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void __thiscall
embree::sse2::
BVHNIntersector1<4,_1,_false,_embree::sse2::ArrayIntersector1<embree::sse2::TriangleMiIntersector1Moeller<4,_true>_>_>
::occluded(BVHNIntersector1<4,_1,_false,_embree::sse2::ArrayIntersector1<embree::sse2::TriangleMiIntersector1Moeller<4,_true>_>_>
           *this,Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined8 *puVar9;
  undefined4 uVar10;
  long lVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  ulong *puVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  float fVar29;
  float fVar32;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar33;
  float fVar38;
  float fVar39;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  uint uVar59;
  float fVar60;
  uint uVar61;
  float fVar62;
  uint uVar63;
  float fVar64;
  uint uVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  int local_a2c;
  float local_a28;
  float fStack_a24;
  float fStack_a20;
  float fStack_a1c;
  long local_a10;
  undefined8 local_a08;
  float fStack_a00;
  float fStack_9fc;
  undefined1 local_9f8 [16];
  undefined8 local_9e8;
  float fStack_9e0;
  float fStack_9dc;
  RayQueryContext *local_9d0;
  ulong local_9c8;
  ulong local_9c0;
  long local_9b8;
  long local_9b0;
  float local_9a8;
  float local_9a4;
  float local_9a0;
  undefined4 local_99c;
  float local_998;
  undefined4 local_994;
  uint local_990;
  undefined4 local_98c;
  undefined4 local_988;
  int *local_978;
  Scene *local_970;
  RayQueryContext *local_968;
  Intersectors *local_960;
  float *local_958;
  undefined4 local_950;
  float local_948;
  float fStack_944;
  float fStack_940;
  float fStack_93c;
  float local_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float local_928;
  float fStack_924;
  float fStack_920;
  float fStack_91c;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float local_908;
  float fStack_904;
  float fStack_900;
  float fStack_8fc;
  float local_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float local_8e8;
  float fStack_8e4;
  float fStack_8e0;
  float fStack_8dc;
  float local_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  undefined1 local_8c8 [16];
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined1 local_898 [16];
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  float local_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float local_868;
  float fStack_864;
  float fStack_860;
  float fStack_85c;
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  float local_818 [4];
  undefined1 local_808 [16];
  float local_7f8 [4];
  float local_7e8 [4];
  ulong local_7d8;
  ulong local_7d0 [244];
  
  if ((*(ulong *)(*(long *)this + 0x70) != 8) &&
     (local_8d8 = *(float *)&(This->intersector1).intersect, 0.0 <= local_8d8)) {
    local_9e8 = local_7d0;
    local_7d8 = *(ulong *)(*(long *)this + 0x70);
    local_918 = *(float *)&This->ptr;
    local_928 = *(float *)((long)&This->ptr + 4);
    local_8e8 = *(float *)&This->leafIntersector;
    fVar29 = *(float *)((long)&This->leafIntersector + 4);
    fVar66 = *(float *)&(This->collider).collide;
    fVar58 = *(float *)((long)&(This->collider).collide + 4);
    fVar32 = *(float *)&(This->collider).name;
    fVar67 = *(float *)((long)&(This->collider).name + 4);
    local_8f8 = 0.0;
    if (0.0 <= fVar29) {
      local_8f8 = fVar29;
    }
    uVar25 = -(uint)(1e-18 <= ABS(fVar66));
    uVar26 = -(uint)(1e-18 <= ABS(fVar58));
    uVar27 = -(uint)(1e-18 <= ABS(fVar32));
    uVar28 = -(uint)(1e-18 <= ABS(fVar67));
    auVar34._0_4_ = (uint)fVar66 & uVar25;
    auVar34._4_4_ = (uint)fVar58 & uVar26;
    auVar34._8_4_ = (uint)fVar32 & uVar27;
    auVar34._12_4_ = (uint)fVar67 & uVar28;
    auVar41._0_8_ = CONCAT44(~uVar26,~uVar25) & 0x219392ef219392ef;
    auVar41._8_4_ = ~uVar27 & 0x219392ef;
    auVar41._12_4_ = ~uVar28 & 0x219392ef;
    auVar41 = auVar41 | auVar34;
    auVar34 = rcpps(auVar34,auVar41);
    local_938 = auVar34._0_4_;
    local_948 = auVar34._4_4_;
    local_908 = auVar34._8_4_;
    local_938 = (1.0 - auVar41._0_4_ * local_938) * local_938 + local_938;
    local_948 = (1.0 - auVar41._4_4_ * local_948) * local_948 + local_948;
    local_908 = (1.0 - auVar41._8_4_ * local_908) * local_908 + local_908;
    uVar21 = (ulong)(local_938 < 0.0) << 4;
    uVar22 = (ulong)(local_948 < 0.0) << 4 | 0x20;
    uVar19 = (ulong)(local_908 < 0.0) << 4 | 0x40;
    uVar23 = uVar21 ^ 0x10;
    local_8c8 = mm_lookupmask_ps._240_16_;
    fStack_8d4 = local_8d8;
    fStack_8d0 = local_8d8;
    fStack_8cc = local_8d8;
    fStack_8e4 = local_8e8;
    fStack_8e0 = local_8e8;
    fStack_8dc = local_8e8;
    fStack_8f4 = local_8f8;
    fStack_8f0 = local_8f8;
    fStack_8ec = local_8f8;
    fStack_904 = local_908;
    fStack_900 = local_908;
    fStack_8fc = local_908;
    fStack_914 = local_918;
    fStack_910 = local_918;
    fStack_90c = local_918;
    fStack_924 = local_928;
    fStack_920 = local_928;
    fStack_91c = local_928;
    fStack_934 = local_938;
    fStack_930 = local_938;
    fStack_92c = local_938;
    fStack_944 = local_948;
    fStack_940 = local_948;
    fStack_93c = local_948;
    fVar29 = local_908;
    fVar66 = local_908;
    fVar58 = local_908;
    fVar32 = local_908;
    fVar67 = local_8d8;
    fVar60 = local_8d8;
    fVar68 = local_8d8;
    fVar62 = local_8d8;
    fVar69 = local_8e8;
    fVar64 = local_8e8;
    fVar71 = local_8e8;
    fVar73 = local_8e8;
    fVar75 = local_8f8;
    fVar52 = local_8f8;
    fVar54 = local_8f8;
    fVar56 = local_8f8;
    fVar33 = local_918;
    fVar38 = local_918;
    fVar39 = local_918;
    fVar40 = local_918;
    fVar45 = local_928;
    fVar46 = local_928;
    fVar47 = local_928;
    fVar48 = local_928;
    fVar49 = local_938;
    fVar50 = local_938;
    fVar51 = local_938;
    fVar53 = local_938;
    fVar55 = local_948;
    fVar57 = local_948;
    fVar70 = local_948;
    fVar72 = local_948;
LAB_0018eb8a:
    do {
      uVar24 = local_9e8[-1];
      local_9e8 = local_9e8 + -1;
      while ((uVar24 & 8) == 0) {
        pfVar8 = (float *)(uVar24 + 0x20 + uVar21);
        auVar30._0_4_ = (*pfVar8 - fVar33) * fVar49;
        auVar30._4_4_ = (pfVar8[1] - fVar38) * fVar50;
        auVar30._8_4_ = (pfVar8[2] - fVar39) * fVar51;
        auVar30._12_4_ = (pfVar8[3] - fVar40) * fVar53;
        pfVar8 = (float *)(uVar24 + 0x20 + uVar22);
        auVar35._0_4_ = (*pfVar8 - fVar45) * fVar55;
        auVar35._4_4_ = (pfVar8[1] - fVar46) * fVar57;
        auVar35._8_4_ = (pfVar8[2] - fVar47) * fVar70;
        auVar35._12_4_ = (pfVar8[3] - fVar48) * fVar72;
        auVar34 = maxps(auVar30,auVar35);
        pfVar8 = (float *)(uVar24 + 0x20 + uVar19);
        auVar36._0_4_ = (*pfVar8 - fVar69) * fVar29;
        auVar36._4_4_ = (pfVar8[1] - fVar64) * fVar66;
        auVar36._8_4_ = (pfVar8[2] - fVar71) * fVar58;
        auVar36._12_4_ = (pfVar8[3] - fVar73) * fVar32;
        auVar13._4_4_ = fVar52;
        auVar13._0_4_ = fVar75;
        auVar13._8_4_ = fVar54;
        auVar13._12_4_ = fVar56;
        auVar41 = maxps(auVar36,auVar13);
        auVar34 = maxps(auVar34,auVar41);
        pfVar8 = (float *)(uVar24 + 0x20 + uVar23);
        auVar37._0_4_ = (*pfVar8 - fVar33) * fVar49;
        auVar37._4_4_ = (pfVar8[1] - fVar38) * fVar50;
        auVar37._8_4_ = (pfVar8[2] - fVar39) * fVar51;
        auVar37._12_4_ = (pfVar8[3] - fVar40) * fVar53;
        pfVar8 = (float *)(uVar24 + 0x20 + (uVar22 ^ 0x10));
        auVar42._0_4_ = (*pfVar8 - fVar45) * fVar55;
        auVar42._4_4_ = (pfVar8[1] - fVar46) * fVar57;
        auVar42._8_4_ = (pfVar8[2] - fVar47) * fVar70;
        auVar42._12_4_ = (pfVar8[3] - fVar48) * fVar72;
        auVar41 = minps(auVar37,auVar42);
        pfVar8 = (float *)(uVar24 + 0x20 + (uVar19 ^ 0x10));
        auVar43._0_4_ = (*pfVar8 - fVar69) * fVar29;
        auVar43._4_4_ = (pfVar8[1] - fVar64) * fVar66;
        auVar43._8_4_ = (pfVar8[2] - fVar71) * fVar58;
        auVar43._12_4_ = (pfVar8[3] - fVar73) * fVar32;
        auVar44._4_4_ = fVar60;
        auVar44._0_4_ = fVar67;
        auVar44._8_4_ = fVar68;
        auVar44._12_4_ = fVar62;
        auVar44 = minps(auVar43,auVar44);
        auVar41 = minps(auVar41,auVar44);
        auVar31._4_4_ = -(uint)(auVar34._4_4_ <= auVar41._4_4_);
        auVar31._0_4_ = -(uint)(auVar34._0_4_ <= auVar41._0_4_);
        auVar31._8_4_ = -(uint)(auVar34._8_4_ <= auVar41._8_4_);
        auVar31._12_4_ = -(uint)(auVar34._12_4_ <= auVar41._12_4_);
        uVar25 = movmskps((int)context,auVar31);
        context = (RayQueryContext *)(ulong)uVar25;
        if (uVar25 == 0) {
          if (local_9e8 == &local_7d8) {
            return;
          }
          goto LAB_0018eb8a;
        }
        context = (RayQueryContext *)(ulong)(byte)uVar25;
        uVar17 = uVar24 & 0xfffffffffffffff0;
        lVar12 = 0;
        if (context != (RayQueryContext *)0x0) {
          for (; ((byte)uVar25 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
          }
        }
        uVar24 = *(ulong *)(uVar17 + lVar12 * 8);
        uVar25 = (uVar25 & 0xff) - 1 & uVar25 & 0xff;
        if (uVar25 != 0) {
          *local_9e8 = uVar24;
          local_9e8 = local_9e8 + 1;
          lVar12 = 0;
          if (uVar25 != 0) {
            for (; (uVar25 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
            }
          }
          uVar24 = *(ulong *)(uVar17 + lVar12 * 8);
          uVar25 = uVar25 - 1 & uVar25;
          context = (RayQueryContext *)(ulong)uVar25;
          if (uVar25 != 0) {
            do {
              *local_9e8 = uVar24;
              local_9e8 = local_9e8 + 1;
              lVar12 = 0;
              if (context != (RayQueryContext *)0x0) {
                for (; ((ulong)context >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
                }
              }
              uVar24 = *(ulong *)(uVar17 + lVar12 * 8);
              context = (RayQueryContext *)((ulong)context & (ulong)((long)&context[-1].args + 7U));
            } while (context != (RayQueryContext *)0x0);
          }
        }
      }
      local_9b0 = (ulong)((uint)uVar24 & 0xf) - 8;
      if (local_9b0 != 0) {
        uVar24 = uVar24 & 0xfffffffffffffff0;
        local_a10 = *(long *)&(ray->org).field_0;
        local_9b8 = 0;
        puVar20 = local_9e8;
        do {
          lVar18 = local_9b8 * 0x50;
          lVar12 = *(long *)(local_a10 + 0x228);
          lVar11 = *(long *)(lVar12 + (ulong)*(uint *)(uVar24 + 0x30 + lVar18) * 8);
          pfVar8 = (float *)(lVar11 + (ulong)*(uint *)(uVar24 + lVar18) * 4);
          fVar29 = *pfVar8;
          fVar66 = pfVar8[1];
          fVar58 = pfVar8[2];
          pfVar8 = (float *)(lVar11 + (ulong)*(uint *)(uVar24 + 0x10 + lVar18) * 4);
          pfVar1 = (float *)(lVar11 + (ulong)*(uint *)(uVar24 + 0x20 + lVar18) * 4);
          lVar11 = *(long *)(lVar12 + (ulong)*(uint *)(uVar24 + 0x34 + lVar18) * 8);
          pfVar2 = (float *)(lVar11 + (ulong)*(uint *)(uVar24 + 4 + lVar18) * 4);
          fVar32 = *pfVar2;
          fVar67 = pfVar2[1];
          fVar60 = pfVar2[2];
          pfVar2 = (float *)(lVar11 + (ulong)*(uint *)(uVar24 + 0x14 + lVar18) * 4);
          pfVar3 = (float *)(lVar11 + (ulong)*(uint *)(uVar24 + 0x24 + lVar18) * 4);
          lVar11 = *(long *)(lVar12 + (ulong)*(uint *)(uVar24 + 0x38 + lVar18) * 8);
          pfVar4 = (float *)(lVar11 + (ulong)*(uint *)(uVar24 + 8 + lVar18) * 4);
          fStack_9e0 = *pfVar4;
          fVar68 = pfVar4[1];
          fVar62 = pfVar4[2];
          pfVar4 = (float *)(lVar11 + (ulong)*(uint *)(uVar24 + 0x18 + lVar18) * 4);
          pfVar5 = (float *)(lVar11 + (ulong)*(uint *)(uVar24 + 0x28 + lVar18) * 4);
          context = *(RayQueryContext **)(lVar12 + (ulong)*(uint *)(uVar24 + 0x3c + lVar18) * 8);
          pfVar6 = (float *)((long)&context->scene + (ulong)*(uint *)(uVar24 + 0xc + lVar18) * 4);
          fStack_9dc = *pfVar6;
          fVar69 = pfVar6[1];
          fVar64 = pfVar6[2];
          pfVar6 = (float *)((long)&context->scene + (ulong)*(uint *)(uVar24 + 0x1c + lVar18) * 4);
          pfVar7 = (float *)((long)&context->scene + (ulong)*(uint *)(uVar24 + 0x2c + lVar18) * 4);
          puVar9 = (undefined8 *)(uVar24 + 0x30 + lVar18);
          local_8a8 = *puVar9;
          uStack_8a0 = puVar9[1];
          puVar9 = (undefined8 *)(uVar24 + 0x40 + lVar18);
          local_8b8 = *puVar9;
          uStack_8b0 = puVar9[1];
          fVar45 = fVar29 - *pfVar8;
          fVar46 = fVar32 - *pfVar2;
          fStack_a00 = fStack_9e0 - *pfVar4;
          fStack_9fc = fStack_9dc - *pfVar6;
          local_a08 = (RayQueryContext *)CONCAT44(fVar46,fVar45);
          fVar70 = fVar66 - pfVar8[1];
          fVar72 = fVar67 - pfVar2[1];
          fVar74 = fVar68 - pfVar4[1];
          fVar76 = fVar69 - pfVar6[1];
          fVar78 = fVar58 - pfVar8[2];
          fVar79 = fVar60 - pfVar2[2];
          fVar80 = fVar62 - pfVar4[2];
          fVar81 = fVar64 - pfVar6[2];
          fVar33 = *pfVar1 - fVar29;
          fVar38 = *pfVar3 - fVar32;
          fVar39 = *pfVar5 - fStack_9e0;
          fVar40 = *pfVar7 - fStack_9dc;
          fVar51 = pfVar1[1] - fVar66;
          fVar53 = pfVar3[1] - fVar67;
          fVar55 = pfVar5[1] - fVar68;
          fVar57 = pfVar7[1] - fVar69;
          fVar47 = pfVar1[2] - fVar58;
          fVar48 = pfVar3[2] - fVar60;
          fVar49 = pfVar5[2] - fVar62;
          fVar50 = pfVar7[2] - fVar64;
          local_a28 = fVar78 * fVar51 - fVar70 * fVar47;
          fStack_a24 = fVar79 * fVar53 - fVar72 * fVar48;
          fStack_a20 = fVar80 * fVar55 - fVar74 * fVar49;
          fStack_a1c = fVar81 * fVar57 - fVar76 * fVar50;
          fVar71 = *(float *)&This->ptr;
          fVar73 = *(float *)((long)&This->ptr + 4);
          fVar75 = *(float *)&This->leafIntersector;
          fVar52 = *(float *)&(This->collider).collide;
          fVar54 = *(float *)((long)&(This->collider).collide + 4);
          fVar56 = *(float *)&(This->collider).name;
          fVar29 = fVar29 - fVar71;
          fVar32 = fVar32 - fVar71;
          fStack_9e0 = fStack_9e0 - fVar71;
          fStack_9dc = fStack_9dc - fVar71;
          local_9f8._0_4_ = fVar66 - fVar73;
          local_9f8._4_4_ = fVar67 - fVar73;
          local_9f8._8_4_ = fVar68 - fVar73;
          local_9f8._12_4_ = fVar69 - fVar73;
          fVar86 = fVar29 * fVar54 - local_9f8._0_4_ * fVar52;
          fVar87 = fVar32 * fVar54 - local_9f8._4_4_ * fVar52;
          fVar88 = fStack_9e0 * fVar54 - local_9f8._8_4_ * fVar52;
          fVar89 = fStack_9dc * fVar54 - local_9f8._12_4_ * fVar52;
          local_7f8[0] = fVar45 * fVar47 - fVar78 * fVar33;
          local_7f8[1] = fVar46 * fVar48 - fVar79 * fVar38;
          local_7f8[2] = fStack_a00 * fVar49 - fVar80 * fVar39;
          local_7f8[3] = fStack_9fc * fVar50 - fVar81 * fVar40;
          fVar58 = fVar58 - fVar75;
          fVar60 = fVar60 - fVar75;
          fVar62 = fVar62 - fVar75;
          fVar64 = fVar64 - fVar75;
          local_9e8 = (ulong *)CONCAT44(fVar32,fVar29);
          fVar82 = fVar58 * fVar52 - fVar29 * fVar56;
          fVar83 = fVar60 * fVar52 - fVar32 * fVar56;
          fVar84 = fVar62 * fVar52 - fStack_9e0 * fVar56;
          fVar85 = fVar64 * fVar52 - fStack_9dc * fVar56;
          local_7e8[0] = fVar70 * fVar33 - fVar45 * fVar51;
          local_7e8[1] = fVar72 * fVar38 - fVar46 * fVar53;
          local_7e8[2] = fVar74 * fVar39 - fStack_a00 * fVar55;
          local_7e8[3] = fVar76 * fVar40 - fStack_9fc * fVar57;
          fVar71 = local_9f8._0_4_ * fVar56 - fVar58 * fVar54;
          fVar73 = local_9f8._4_4_ * fVar56 - fVar60 * fVar54;
          fVar75 = local_9f8._8_4_ * fVar56 - fVar62 * fVar54;
          fVar77 = local_9f8._12_4_ * fVar56 - fVar64 * fVar54;
          fVar66 = fVar52 * local_a28 + fVar54 * local_7f8[0] + fVar56 * local_7e8[0];
          fVar67 = fVar52 * fStack_a24 + fVar54 * local_7f8[1] + fVar56 * local_7e8[1];
          fVar68 = fVar52 * fStack_a20 + fVar54 * local_7f8[2] + fVar56 * local_7e8[2];
          fVar69 = fVar52 * fStack_a1c + fVar54 * local_7f8[3] + fVar56 * local_7e8[3];
          uVar25 = (uint)fVar66 & 0x80000000;
          uVar26 = (uint)fVar67 & 0x80000000;
          uVar27 = (uint)fVar68 & 0x80000000;
          uVar28 = (uint)fVar69 & 0x80000000;
          local_898._0_4_ =
               (float)((uint)(fVar33 * fVar71 + fVar51 * fVar82 + fVar47 * fVar86) ^ uVar25);
          local_898._4_4_ =
               (float)((uint)(fVar38 * fVar73 + fVar53 * fVar83 + fVar48 * fVar87) ^ uVar26);
          local_898._8_4_ =
               (float)((uint)(fVar39 * fVar75 + fVar55 * fVar84 + fVar49 * fVar88) ^ uVar27);
          local_898._12_4_ =
               (float)((uint)(fVar40 * fVar77 + fVar57 * fVar85 + fVar50 * fVar89) ^ uVar28);
          local_888 = (float)((uint)(fVar71 * fVar45 + fVar82 * fVar70 + fVar86 * fVar78) ^ uVar25);
          fStack_884 = (float)((uint)(fVar73 * fVar46 + fVar83 * fVar72 + fVar87 * fVar79) ^ uVar26)
          ;
          fStack_880 = (float)((uint)(fVar75 * fStack_a00 + fVar84 * fVar74 + fVar88 * fVar80) ^
                              uVar27);
          fStack_87c = (float)((uint)(fVar77 * fStack_9fc + fVar85 * fVar76 + fVar89 * fVar81) ^
                              uVar28);
          local_868 = ABS(fVar66);
          fStack_864 = ABS(fVar67);
          fStack_860 = ABS(fVar68);
          fStack_85c = ABS(fVar69);
          uVar59 = -(uint)(local_898._0_4_ + local_888 <= local_868) &
                   -(uint)((0.0 <= local_888 && 0.0 <= local_898._0_4_) && fVar66 != 0.0) &
                   local_8c8._0_4_;
          uVar61 = -(uint)(local_898._4_4_ + fStack_884 <= fStack_864) &
                   -(uint)((0.0 <= fStack_884 && 0.0 <= local_898._4_4_) && fVar67 != 0.0) &
                   local_8c8._4_4_;
          uVar63 = -(uint)(local_898._8_4_ + fStack_880 <= fStack_860) &
                   -(uint)((0.0 <= fStack_880 && 0.0 <= local_898._8_4_) && fVar68 != 0.0) &
                   local_8c8._8_4_;
          uVar65 = -(uint)(local_898._12_4_ + fStack_87c <= fStack_85c) &
                   -(uint)((0.0 <= fStack_87c && 0.0 <= local_898._12_4_) && fVar69 != 0.0) &
                   local_8c8._12_4_;
          auVar15._4_4_ = uVar61;
          auVar15._0_4_ = uVar59;
          auVar15._8_4_ = uVar63;
          auVar15._12_4_ = uVar65;
          iVar16 = movmskps((int)lVar18,auVar15);
          local_9e8 = puVar20;
          if (iVar16 != 0) {
            local_878 = (float)(uVar25 ^ (uint)(fVar29 * local_a28 +
                                               local_9f8._0_4_ * local_7f8[0] +
                                               fVar58 * local_7e8[0]));
            fStack_874 = (float)(uVar26 ^ (uint)(fVar32 * fStack_a24 +
                                                local_9f8._4_4_ * local_7f8[1] +
                                                fVar60 * local_7e8[1]));
            fStack_870 = (float)(uVar27 ^ (uint)(fStack_9e0 * fStack_a20 +
                                                local_9f8._8_4_ * local_7f8[2] +
                                                fVar62 * local_7e8[2]));
            fStack_86c = (float)(uVar28 ^ (uint)(fStack_9dc * fStack_a1c +
                                                local_9f8._12_4_ * local_7f8[3] +
                                                fVar64 * local_7e8[3]));
            fVar29 = *(float *)((long)&This->leafIntersector + 4);
            fVar66 = *(float *)&(This->intersector1).intersect;
            local_848._0_4_ =
                 -(uint)(local_878 <= fVar66 * local_868 && fVar29 * local_868 < local_878) & uVar59
            ;
            local_848._4_4_ =
                 -(uint)(fStack_874 <= fVar66 * fStack_864 && fVar29 * fStack_864 < fStack_874) &
                 uVar61;
            local_848._8_4_ =
                 -(uint)(fStack_870 <= fVar66 * fStack_860 && fVar29 * fStack_860 < fStack_870) &
                 uVar63;
            local_848._12_4_ =
                 -(uint)(fStack_86c <= fVar66 * fStack_85c && fVar29 * fStack_85c < fStack_86c) &
                 uVar65;
            uVar25 = movmskps(iVar16,local_848);
            if (uVar25 != 0) {
              local_808._4_4_ = fStack_a24;
              local_808._0_4_ = local_a28;
              local_808._8_4_ = fStack_a20;
              local_808._12_4_ = fStack_a1c;
              auVar14._4_4_ = fStack_864;
              auVar14._0_4_ = local_868;
              auVar14._8_4_ = fStack_860;
              auVar14._12_4_ = fStack_85c;
              auVar34 = rcpps(local_808,auVar14);
              fVar29 = auVar34._0_4_;
              fVar66 = auVar34._4_4_;
              fVar58 = auVar34._8_4_;
              fVar32 = auVar34._12_4_;
              fVar29 = (1.0 - local_868 * fVar29) * fVar29 + fVar29;
              fVar66 = (1.0 - fStack_864 * fVar66) * fVar66 + fVar66;
              fVar58 = (1.0 - fStack_860 * fVar58) * fVar58 + fVar58;
              fVar32 = (1.0 - fStack_85c * fVar32) * fVar32 + fVar32;
              local_818[0] = local_878 * fVar29;
              local_818[1] = fStack_874 * fVar66;
              local_818[2] = fStack_870 * fVar58;
              local_818[3] = fStack_86c * fVar32;
              local_838._0_4_ = local_898._0_4_ * fVar29;
              local_838._4_4_ = local_898._4_4_ * fVar66;
              local_838._8_4_ = local_898._8_4_ * fVar58;
              local_838._12_4_ = local_898._12_4_ * fVar32;
              local_828._0_4_ = fVar29 * local_888;
              local_828._4_4_ = fVar66 * fStack_884;
              local_828._8_4_ = fVar58 * fStack_880;
              local_828._12_4_ = fVar32 * fStack_87c;
              local_9c0 = (ulong)(uVar25 & 0xff);
              do {
                local_9c8 = 0;
                if (local_9c0 != 0) {
                  for (; (local_9c0 >> local_9c8 & 1) == 0; local_9c8 = local_9c8 + 1) {
                  }
                }
                local_990 = *(uint *)((long)&local_8a8 + local_9c8 * 4);
                local_9d0 = *(RayQueryContext **)
                             (*(long *)(local_a10 + 0x1e8) + (ulong)local_990 * 8);
                uVar25 = *(uint *)((long)&(This->intersector1).intersect + 4);
                context = (RayQueryContext *)(ulong)uVar25;
                if ((*(uint *)((long)&local_9d0[2].scene + 4) & uVar25) == 0) {
                  local_9c0 = local_9c0 ^ 1L << (local_9c8 & 0x3f);
                }
                else {
                  local_a08 = *(RayQueryContext **)&(ray->dir).field_0;
                  if ((local_a08->args == (RTCIntersectArguments *)0x0) &&
                     (local_9d0[3].scene == (Scene *)0x0)) {
LAB_0018f2c0:
                    *(undefined4 *)&(This->intersector1).intersect = 0xff800000;
                    return;
                  }
                  local_9f8._0_8_ = uVar21;
                  context = *(RayQueryContext **)((long)&(ray->org).field_0 + 8);
                  local_9a8 = local_7f8[local_9c8 - 4];
                  local_9a4 = local_7f8[local_9c8];
                  local_9a0 = local_7e8[local_9c8];
                  local_99c = *(undefined4 *)(local_838 + local_9c8 * 4);
                  local_998 = local_818[local_9c8 - 4];
                  local_994 = *(undefined4 *)((long)&local_8b8 + local_9c8 * 4);
                  local_98c = *(undefined4 *)&context->scene;
                  local_988 = *(undefined4 *)((long)&context->scene + 4);
                  uVar10 = *(undefined4 *)&(This->intersector1).intersect;
                  *(float *)&(This->intersector1).intersect = local_818[local_9c8];
                  local_a2c = -1;
                  local_978 = &local_a2c;
                  local_970 = local_9d0[1].scene;
                  local_a28 = SUB84(This,0);
                  fStack_a24 = (float)((ulong)This >> 0x20);
                  local_958 = &local_9a8;
                  local_950 = 1;
                  local_968 = context;
                  local_960 = This;
                  if (((local_9d0[3].scene == (Scene *)0x0) ||
                      ((*(code *)local_9d0[3].scene)(&local_978), *local_978 != 0)) &&
                     ((local_a08->args == (RTCIntersectArguments *)0x0 ||
                      (((context = local_a08, ((ulong)local_a08->scene & 2) == 0 &&
                        (context = local_9d0, ((ulong)local_9d0[2].user & 0x40000000000000) == 0))
                       || ((*(code *)local_a08->args)(&local_978), *local_978 != 0)))))) {
                    This = (Intersectors *)CONCAT44(fStack_a24,local_a28);
                    goto LAB_0018f2c0;
                  }
                  This = (Intersectors *)CONCAT44(fStack_a24,local_a28);
                  *(undefined4 *)&(This->intersector1).intersect = uVar10;
                  local_9c0 = local_9c0 ^ 1L << (local_9c8 & 0x3f);
                  uVar21 = local_9f8._0_8_;
                }
              } while (local_9c0 != 0);
            }
          }
          local_9b8 = local_9b8 + 1;
          puVar20 = local_9e8;
        } while (local_9b8 != local_9b0);
      }
      fVar29 = local_908;
      fVar66 = fStack_904;
      fVar58 = fStack_900;
      fVar32 = fStack_8fc;
      fVar67 = local_8d8;
      fVar60 = fStack_8d4;
      fVar68 = fStack_8d0;
      fVar62 = fStack_8cc;
      fVar69 = local_8e8;
      fVar64 = fStack_8e4;
      fVar71 = fStack_8e0;
      fVar73 = fStack_8dc;
      fVar75 = local_8f8;
      fVar52 = fStack_8f4;
      fVar54 = fStack_8f0;
      fVar56 = fStack_8ec;
      fVar33 = local_918;
      fVar38 = fStack_914;
      fVar39 = fStack_910;
      fVar40 = fStack_90c;
      fVar45 = local_928;
      fVar46 = fStack_924;
      fVar47 = fStack_920;
      fVar48 = fStack_91c;
      fVar49 = local_938;
      fVar50 = fStack_934;
      fVar51 = fStack_930;
      fVar53 = fStack_92c;
      fVar55 = local_948;
      fVar57 = fStack_944;
      fVar70 = fStack_940;
      fVar72 = fStack_93c;
    } while (local_9e8 != &local_7d8);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }